

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O2

void __thiscall icu_63::RuleBasedNumberFormat::dispose(RuleBasedNumberFormat *this)

{
  NFRuleSet *this_00;
  UnicodeString *pUVar1;
  NFRule *pNVar2;
  LocalizationInfo *pLVar3;
  void *in_RSI;
  long lVar4;
  NFRuleSet **p;
  NFRuleSet **ppNVar5;
  
  ppNVar5 = this->fRuleSets;
  if (ppNVar5 != (NFRuleSet **)0x0) {
    for (; this_00 = *ppNVar5, this_00 != (NFRuleSet *)0x0; ppNVar5 = ppNVar5 + 1) {
      NFRuleSet::~NFRuleSet(this_00);
      UMemory::operator_delete((UMemory *)this_00,in_RSI);
    }
    uprv_free_63(this->fRuleSets);
    this->fRuleSets = (NFRuleSet **)0x0;
  }
  pUVar1 = this->ruleSetDescriptions;
  if (pUVar1 != (UnicodeString *)0x0) {
    lVar4 = *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    if (lVar4 != 0) {
      lVar4 = lVar4 << 6;
      do {
        icu_63::UnicodeString::~UnicodeString
                  ((UnicodeString *)
                   ((long)&pUVar1[-1].super_Replaceable.super_UObject._vptr_UObject + lVar4));
        lVar4 = lVar4 + -0x40;
      } while (lVar4 != 0);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
    this->ruleSetDescriptions = (UnicodeString *)0x0;
  }
  if (this->collator != (RuleBasedCollator *)0x0) {
    (*(this->collator->super_Collator).super_UObject._vptr_UObject[1])();
  }
  this->collator = (RuleBasedCollator *)0x0;
  if (this->decimalFormatSymbols != (DecimalFormatSymbols *)0x0) {
    (*(this->decimalFormatSymbols->super_UObject)._vptr_UObject[1])();
  }
  this->decimalFormatSymbols = (DecimalFormatSymbols *)0x0;
  pNVar2 = this->defaultInfinityRule;
  if (pNVar2 != (NFRule *)0x0) {
    NFRule::~NFRule(pNVar2);
  }
  UMemory::operator_delete((UMemory *)pNVar2,in_RSI);
  this->defaultInfinityRule = (NFRule *)0x0;
  pNVar2 = this->defaultNaNRule;
  if (pNVar2 != (NFRule *)0x0) {
    NFRule::~NFRule(pNVar2);
  }
  UMemory::operator_delete((UMemory *)pNVar2,in_RSI);
  this->defaultNaNRule = (NFRule *)0x0;
  if (this->lenientParseRules != (UnicodeString *)0x0) {
    (*(this->lenientParseRules->super_Replaceable).super_UObject._vptr_UObject[1])();
  }
  this->lenientParseRules = (UnicodeString *)0x0;
  if (this->capitalizationBrkIter != (BreakIterator *)0x0) {
    (*(this->capitalizationBrkIter->super_UObject)._vptr_UObject[1])();
  }
  this->capitalizationBrkIter = (BreakIterator *)0x0;
  if (this->localizations != (LocalizationInfo *)0x0) {
    pLVar3 = LocalizationInfo::unref(this->localizations);
    this->localizations = pLVar3;
  }
  return;
}

Assistant:

void
RuleBasedNumberFormat::dispose()
{
    if (fRuleSets) {
        for (NFRuleSet** p = fRuleSets; *p; ++p) {
            delete *p;
        }
        uprv_free(fRuleSets);
        fRuleSets = NULL;
    }

    if (ruleSetDescriptions) {
        delete [] ruleSetDescriptions;
        ruleSetDescriptions = NULL;
    }

#if !UCONFIG_NO_COLLATION
    delete collator;
#endif
    collator = NULL;

    delete decimalFormatSymbols;
    decimalFormatSymbols = NULL;

    delete defaultInfinityRule;
    defaultInfinityRule = NULL;

    delete defaultNaNRule;
    defaultNaNRule = NULL;

    delete lenientParseRules;
    lenientParseRules = NULL;

#if !UCONFIG_NO_BREAK_ITERATION
    delete capitalizationBrkIter;
    capitalizationBrkIter = NULL;
#endif

    if (localizations) {
        localizations = localizations->unref();
    }
}